

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMapping.c
# Opt level: O0

void Mips_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  cs_detail *pcVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint local_20;
  uint i;
  uint id_local;
  cs_insn *insn_local;
  cs_struct *h_local;
  
  local_20 = 0;
  while( true ) {
    if (1 < local_20) {
      uVar2 = insn_find(insns,0x5dc,id,&h->insn_cache);
      uVar3 = (uint)uVar2;
      if ((uVar3 != 0) && (insn->id = (uint)insns[uVar3].mapid, h->detail != CS_OPT_OFF)) {
        pcVar1 = insn->detail;
        *(undefined8 *)pcVar1->regs_read = *(undefined8 *)insns[uVar3].regs_use;
        *(undefined4 *)(pcVar1->regs_read + 8) = *(undefined4 *)(insns[uVar3].regs_use + 8);
        uVar4 = count_positive(insns[uVar3].regs_use);
        insn->detail->regs_read_count = (uint8_t)uVar4;
        pcVar1 = insn->detail;
        *(undefined8 *)pcVar1->regs_write = *(undefined8 *)insns[uVar3].regs_mod;
        *(undefined8 *)(pcVar1->regs_write + 8) = *(undefined8 *)(insns[uVar3].regs_mod + 8);
        *(undefined4 *)(pcVar1->regs_write + 0x10) = *(undefined4 *)(insns[uVar3].regs_mod + 0x10);
        uVar4 = count_positive(insns[uVar3].regs_mod);
        insn->detail->regs_write_count = (uint8_t)uVar4;
        *(undefined8 *)insn->detail->groups = *(undefined8 *)insns[uVar3].groups;
        uVar4 = count_positive(insns[uVar3].groups);
        insn->detail->groups_count = (uint8_t)uVar4;
        if (((insns[uVar3].branch & 1U) != 0) || ((insns[uVar3].indirect_branch & 1U) != 0)) {
          insn->detail->groups[insn->detail->groups_count] = '\x01';
          insn->detail->groups_count = insn->detail->groups_count + '\x01';
        }
      }
      return;
    }
    if (alias_insns[local_20].id == id) break;
    local_20 = local_20 + 1;
  }
  insn->id = (uint)alias_insns[local_20].mapid;
  if (h->detail == CS_OPT_OFF) {
    return;
  }
  pcVar1 = insn->detail;
  *(undefined8 *)pcVar1->regs_read = *(undefined8 *)alias_insns[local_20].regs_use;
  *(undefined4 *)(pcVar1->regs_read + 8) = *(undefined4 *)(alias_insns[local_20].regs_use + 8);
  uVar3 = count_positive(alias_insns[local_20].regs_use);
  insn->detail->regs_read_count = (uint8_t)uVar3;
  pcVar1 = insn->detail;
  uVar5 = (ulong)local_20;
  *(undefined8 *)pcVar1->regs_write = *(undefined8 *)alias_insns[uVar5].regs_mod;
  *(undefined8 *)(pcVar1->regs_write + 8) = *(undefined8 *)(alias_insns[uVar5].regs_mod + 8);
  *(undefined4 *)(pcVar1->regs_write + 0x10) = *(undefined4 *)(alias_insns[uVar5].regs_mod + 0x10);
  uVar3 = count_positive(alias_insns[local_20].regs_mod);
  insn->detail->regs_write_count = (uint8_t)uVar3;
  *(undefined8 *)insn->detail->groups = *(undefined8 *)alias_insns[local_20].groups;
  uVar3 = count_positive(alias_insns[local_20].groups);
  insn->detail->groups_count = (uint8_t)uVar3;
  if (((alias_insns[local_20].branch & 1U) == 0) &&
     ((alias_insns[local_20].indirect_branch & 1U) == 0)) {
    return;
  }
  insn->detail->groups[insn->detail->groups_count] = '\x01';
  insn->detail->groups_count = insn->detail->groups_count + '\x01';
  return;
}

Assistant:

void Mips_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned int i;

	// consider alias insn first
	for (i = 0; i < ARR_SIZE(alias_insns); i++) {
		if (alias_insns[i].id == id) {
			insn->id = alias_insns[i].mapid;

			if (h->detail) {
#ifndef CAPSTONE_DIET
				memcpy(insn->detail->regs_read, alias_insns[i].regs_use, sizeof(alias_insns[i].regs_use));
				insn->detail->regs_read_count = (uint8_t)count_positive(alias_insns[i].regs_use);

				memcpy(insn->detail->regs_write, alias_insns[i].regs_mod, sizeof(alias_insns[i].regs_mod));
				insn->detail->regs_write_count = (uint8_t)count_positive(alias_insns[i].regs_mod);

				memcpy(insn->detail->groups, alias_insns[i].groups, sizeof(alias_insns[i].groups));
				insn->detail->groups_count = (uint8_t)count_positive(alias_insns[i].groups);

				if (alias_insns[i].branch || alias_insns[i].indirect_branch) {
					// this insn also belongs to JUMP group. add JUMP group
					insn->detail->groups[insn->detail->groups_count] = MIPS_GRP_JUMP;
					insn->detail->groups_count++;
				}

#endif
			}
			return;
		}
	}

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = MIPS_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
		}
	}
}